

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcObject::~IfcObject(IfcObject *this)

{
  ~IfcObject((IfcObject *)&this[-1].field_0x50);
  return;
}

Assistant:

IfcObject() : Object("IfcObject") {}